

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManCollectObjs_rec(Gia_Man_t *p,int iObjId,Vec_Int_t *vObjs,int Limit)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  
  if (vObjs->nSize != Limit) {
    if (p->nTravIdsAlloc <= iObjId) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x261,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    if (p->pTravIds[iObjId] != p->nTravIds) {
      p->pTravIds[iObjId] = p->nTravIds;
      if ((iObjId < 0) || (p->nObjs <= iObjId)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      uVar3 = (uint)*(undefined8 *)(pGVar1 + (uint)iObjId);
      if ((~uVar3 & 0x1fffffff) == 0 || (int)uVar3 < 0) {
LAB_0023c4e6:
        Vec_IntPush(vObjs,iObjId);
        return;
      }
      Gia_ManCollectObjs_rec(p,iObjId - (uVar3 & 0x1fffffff),vObjs,Limit);
      if (vObjs->nSize != Limit) {
        pGVar1 = pGVar1 + (uint)iObjId;
        pGVar2 = p->pObjs;
        if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Gia_ManCollectObjs_rec
                  (p,(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555 -
                     (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),vObjs,Limit);
        if (vObjs->nSize != Limit) goto LAB_0023c4e6;
      }
    }
  }
  return;
}

Assistant:

void Gia_ManCollectObjs_rec( Gia_Man_t * p, int iObjId, Vec_Int_t * vObjs, int Limit )
{
    Gia_Obj_t * pObj;
    if ( Vec_IntSize(vObjs) == Limit )
        return;
    if ( Gia_ObjIsTravIdCurrentId(p, iObjId) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObjId);
    pObj = Gia_ManObj( p, iObjId );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCollectObjs_rec( p, Gia_ObjFaninId0p(p, pObj), vObjs, Limit );
        if ( Vec_IntSize(vObjs) == Limit )
            return;
        Gia_ManCollectObjs_rec( p, Gia_ObjFaninId1p(p, pObj), vObjs, Limit );
        if ( Vec_IntSize(vObjs) == Limit )
            return;
    }
    Vec_IntPush( vObjs, iObjId );
}